

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

bool google::protobuf::internal::IsDescendant(Message *root,Message *message)

{
  byte bVar1;
  FieldDescriptor *field;
  TaggedPtr p;
  bool bVar2;
  int iVar3;
  Descriptor *pDVar4;
  ReflectionPayload *pRVar5;
  Message *pMVar6;
  Nonnull<const_char_*> pcVar7;
  bool bVar8;
  Reflection *this;
  pointer ppFVar9;
  int index;
  Metadata MVar10;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  MapIterator iter;
  MapIterator end;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  local_e8;
  pointer local_c8;
  MapIterator local_c0;
  MapIterator local_78;
  
  MVar10 = Message::GetMetadata(root);
  this = MVar10.reflection;
  local_e8.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e8.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Reflection::ListFields(this,root,&local_e8);
  local_c8 = local_e8.
             super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  ppFVar9 = local_e8.
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (local_e8.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_e8.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    bVar8 = false;
  }
  else {
    do {
      field = *ppFVar9;
      if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) == 10) {
        bVar1 = field->field_0x1;
        bVar8 = (bool)((bVar1 & 0x20) >> 5);
        if (0xbf < bVar1 != bVar8) {
          pcVar7 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                             (bVar8,0xbf < bVar1,
                              "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&local_78,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                     ,0xb54,pcVar7);
LAB_002a2722:
          absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                    ((LogMessageFatal *)&local_78);
        }
        if ((bVar1 & 0x20) == 0) {
          pMVar6 = Reflection::MutableMessage(this,root,field,(MessageFactory *)0x0);
          bVar8 = true;
          if ((pMVar6 == message) || (bVar2 = IsDescendant(pMVar6,message), bVar2))
          goto LAB_002a26c4;
        }
        else if ((field->type_ == 0xb) &&
                (bVar8 = FieldDescriptor::is_map_message_type(field), bVar8)) {
          pDVar4 = FieldDescriptor::message_type(field);
          if ((long)pDVar4->field_count_ < 2) {
            pcVar7 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                               (1,(long)pDVar4->field_count_,"index < field_count()");
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)&local_78,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                       ,0xa88,pcVar7);
            goto LAB_002a2722;
          }
          if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)pDVar4->fields_[1].type_ * 4) ==
              10) {
            Reflection::MapEnd(&local_78,this,root,field);
            Reflection::MapBegin(&local_c0,this,root,field);
            while (bVar8 = MapFieldBase::EqualIterator(local_c0.map_,&local_c0,&local_78), !bVar8) {
              p = ((local_c0.map_)->super_MapFieldBaseForParse).payload_._M_i;
              if (((p & 1) != 0) &&
                 (pRVar5 = MapFieldBase::ToPayload(p), pRVar5 != (ReflectionPayload *)0x0)) {
                (pRVar5->state)._M_i = STATE_MODIFIED_MAP;
              }
              pMVar6 = MapValueRef::MutableMessageValue(&local_c0.value_);
              if ((pMVar6 == message) || (bVar8 = IsDescendant(pMVar6,message), bVar8)) {
                bVar8 = true;
                goto LAB_002a26c4;
              }
              MapFieldBase::IncreaseIterator(local_c0.map_,&local_c0);
            }
          }
        }
        else {
          iVar3 = Reflection::FieldSize(this,root,field);
          if (0 < iVar3) {
            index = 0;
            do {
              pMVar6 = Reflection::MutableRepeatedMessage(this,root,field,index);
              bVar8 = true;
              if ((pMVar6 == message) || (bVar2 = IsDescendant(pMVar6,message), bVar2))
              goto LAB_002a26c4;
              index = index + 1;
            } while (iVar3 != index);
          }
        }
      }
      ppFVar9 = ppFVar9 + 1;
    } while (ppFVar9 != local_c8);
    bVar8 = false;
  }
LAB_002a26c4:
  if (local_e8.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e8.
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_e8.
                          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_e8.
                          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return bVar8;
}

Assistant:

bool IsDescendant(Message& root, const Message& message) {
  const Reflection* reflection = root.GetReflection();
  std::vector<const FieldDescriptor*> fields;
  reflection->ListFields(root, &fields);

  for (const auto* field : fields) {
    // Skip non-message fields.
    if (field->cpp_type() != FieldDescriptor::CPPTYPE_MESSAGE) continue;

    // Optional messages.
    if (!field->is_repeated()) {
      Message* sub_message = reflection->MutableMessage(&root, field);
      if (sub_message == &message || IsDescendant(*sub_message, message)) {
        return true;
      }
      continue;
    }

    // Repeated messages.
    if (!IsMapFieldInApi(field)) {
      int count = reflection->FieldSize(root, field);
      for (int i = 0; i < count; i++) {
        Message* sub_message =
            reflection->MutableRepeatedMessage(&root, field, i);
        if (sub_message == &message || IsDescendant(*sub_message, message)) {
          return true;
        }
      }
      continue;
    }

    // Map field: if accessed as repeated fields, messages are *copied* and
    // matching pointer won't work. Must directly access map.
    constexpr int kValIdx = 1;
    const FieldDescriptor* val_field = field->message_type()->field(kValIdx);
    // Skip map fields whose value type is not message.
    if (val_field->cpp_type() != FieldDescriptor::CPPTYPE_MESSAGE) continue;

    MapIterator end = reflection->MapEnd(&root, field);
    for (auto iter = reflection->MapBegin(&root, field); iter != end; ++iter) {
      Message* sub_message = iter.MutableValueRef()->MutableMessageValue();
      if (sub_message == &message || IsDescendant(*sub_message, message)) {
        return true;
      }
    }
  }

  return false;
}